

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter-template.cpp
# Opt level: O2

StateVector * __thiscall
testExtendedKalmanFilter()::KalmanFunctor::stateDynamics(Eigen::Matrix<double,4,1,0,4,1>const&,Eigen
::Matrix<double,1,1,0,1,1>_const__unsigned_int_
          (StateVector *__return_storage_ptr__,void *this,StateVector *xk,InputVector *u,uint k)

{
  CoeffReturnType CVar1;
  CoeffReturnType local_198;
  double local_190;
  InputVector *local_188;
  InputVector *local_180;
  StateVector *local_178;
  StateVector *local_170;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  local_168;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  local_140;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::Matrix<double,4,1,0,4,1>const>>
  local_118 [8];
  long local_110;
  StateVector *local_108;
  double local_f0;
  RhsNested local_e8;
  long local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_c0;
  
  local_178 = xk;
  local_170 = xk;
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_0>
          ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_0>
                   *)&local_178,0);
  local_190 = cos(CVar1 * 10.0);
  Eigen::operator*(&local_140,&local_190,(StorageBaseType *)((long)this + 0x10));
  local_d0 = (long)this + 0x30;
  local_f0 = local_140.m_lhs.m_functor.m_other;
  local_e8 = local_140.m_rhs;
  local_188 = u;
  local_180 = u;
  local_110 = (long)this + 0x80;
  local_108 = xk;
  local_198 = Eigen::
              DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>,_0>
              ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>,_0>
                       *)&local_188,0);
  Eigen::operator*(&local_168,&local_198,(StorageBaseType *)((long)this + 0x10));
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::Matrix<double,4,1,0,4,1>const>>
  ::operator+(&local_c0,local_118,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
               *)&local_168);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
            (__return_storage_ptr__,&local_c0);
  return __return_storage_ptr__;
}

Assistant:

virtual ekf::StateVector stateDynamics(const ekf::StateVector& xk, const ekf::InputVector& u, unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::StateVector xk1;
            xk1=a_*xk+cos(10*(xk.transpose()*xk)[0])*s_+t_+(u*u.transpose())[0]*s_;
            return xk1;
        }